

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O2

_Bool askfor_aux(char *buf,size_t len,
                _func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *keypress_h)

{
  wchar_t x_00;
  _Bool _Var1;
  ulong uVar2;
  code *pcVar3;
  ulong uVar4;
  _Bool _Var5;
  ulong uVar6;
  keypress kVar7;
  wchar_t x;
  wchar_t y;
  size_t k;
  size_t local_38;
  
  k = 0;
  pcVar3 = askfor_aux_keypress;
  if (keypress_h != (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0) {
    pcVar3 = keypress_h;
  }
  Term_locate(&x,&y);
  if (0x4f < (uint)x) {
    x = L'\0';
  }
  x_00 = x;
  uVar6 = (ulong)(uint)(0x50 - x);
  if ((uint)x + len < 0x51) {
    uVar6 = len;
  }
  buf[uVar6 - 1] = '\0';
  local_38 = strlen(buf);
  Term_erase(x_00,y,(wchar_t)uVar6);
  Term_putstr(x,y,L'\xffffffff',L'\v',buf);
  _Var1 = false;
  _Var5 = true;
  uVar4 = 0;
  while (_Var1 == false) {
    Term_gotoxy(x + (int)k,y);
    kVar7 = inkey();
    uVar2 = kVar7._0_8_;
    uVar4 = uVar2 >> 0x20;
    kVar7._8_4_ = kVar7._8_4_ & 0xff;
    kVar7.type = (int)uVar2;
    kVar7.code = (int)(uVar2 >> 0x20);
    _Var1 = (*pcVar3)(buf,uVar6,&k,&local_38,kVar7,_Var5);
    Term_erase(x,y,(wchar_t)uVar6);
    Term_putstr(x,y,L'\xffffffff',L'\x01',buf);
    _Var5 = false;
  }
  return (int)uVar4 != 0xe000;
}

Assistant:

bool askfor_aux(char *buf, size_t len, bool (*keypress_h)(char *, size_t, size_t *, size_t *, struct keypress, bool))
{
	int y, x;

	size_t k = 0;		/* Cursor position */
	size_t nul = 0;		/* Position of the null byte in the string */

	struct keypress ch = KEYPRESS_NULL;

	bool done = false;
	bool firsttime = true;

	if (keypress_h == NULL)
		keypress_h = askfor_aux_keypress;

	/* Locate the cursor */
	Term_locate(&x, &y);

	/* Paranoia */
	if ((x < 0) || (x >= 80)) x = 0;

	/* Restrict the length */
	if (x + len > 80) len = 80 - x;

	/* Truncate the default entry */
	buf[len-1] = '\0';

	/* Get the position of the null byte */
	nul = strlen(buf);

	/* Display the default answer */
	Term_erase(x, y, (int)len);
	Term_putstr(x, y, -1, COLOUR_YELLOW, buf);

	/* Process input */
	while (!done) {
		/* Place cursor */
		Term_gotoxy(x + k, y);

		/* Get a key */
		ch = inkey();

		/* Let the keypress handler deal with the keypress */
		done = keypress_h(buf, len, &k, &nul, ch, firsttime);

		/* Update the entry */
		Term_erase(x, y, (int)len);
		Term_putstr(x, y, -1, COLOUR_WHITE, buf);

		/* Not the first time round anymore */
		firsttime = false;
	}

	/* Done */
	return (ch.code != ESCAPE);
}